

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_optimization.cpp
# Opt level: O1

int main(int argc,char **param_2)

{
  optimizaiton_example_01();
  optimizaiton_example_02();
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------------------------------\n\n"
               ,0x65);
  }
  return 0;
}

Assistant:

int main(int argc, const char**){
/*
 * The purpose of this file is to demonstrate the proper way to call
 * functions from the Tasmanian Optimization Module.
 */
    optimizaiton_example_01();
    optimizaiton_example_02();

    if (argc > 1) return 0; // fast testing used to check if the library linked correctly

    cout << "\n" << "---------------------------------------------------------------------------------------------------\n\n";

    return 0;
}